

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_utilities.h
# Opt level: O0

const_ret_type __thiscall
dlib::
op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
::apply(op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
        *this,long r,long param_3)

{
  long lVar1;
  matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
  *in_RDI;
  const_ret_type cVar2;
  long c;
  type temp;
  long in_stack_ffffffffffffffc8;
  long r_00;
  undefined8 local_28;
  undefined4 local_1c;
  
  local_1c = matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
             ::operator()(in_RDI,in_stack_ffffffffffffffc8,0x280eae);
  local_28 = 1;
  while( true ) {
    r_00 = local_28;
    lVar1 = matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
            ::nc((matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
                  *)0x280ed3);
    if (lVar1 <= r_00) break;
    cVar2 = matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
            ::operator()(in_RDI,r_00,0x280ef6);
    local_1c = cVar2 + local_1c;
    local_28 = local_28 + 1;
  }
  return local_1c;
}

Assistant:

const_ret_type apply ( long r, long ) const
        { 
            type temp = m(r,0);
            for (long c = 1; c < m.nc(); ++c)
                temp += m(r,c);
            return temp; 
        }